

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_tree.cpp
# Opt level: O2

string_view __thiscall Radix_tree::find(Radix_tree *this,string_view key)

{
  pointer this_00;
  vector<Radix_tree::Node,_std::allocator<Radix_tree::Node>_> *__range1;
  string_view sVar1;
  bool local_19;
  
  local_19 = key._M_len != 0;
  assume<bool>(&local_19);
  this_00 = (this->children).super__Vector_base<Radix_tree::Node,_std::allocator<Radix_tree::Node>_>
            ._M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    if (this_00 ==
        (this->children).super__Vector_base<Radix_tree::Node,_std::allocator<Radix_tree::Node>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      return (string_view)ZEXT816(0);
    }
    if (*(this_00->key_part)._M_dataplus._M_p == *key._M_str) break;
    this_00 = this_00 + 1;
  }
  sVar1 = Node::find(this_00,key);
  return sVar1;
}

Assistant:

string_view Radix_tree::find(string_view key) const {
	assume(!key.empty()); //not sure what to do in this case yet
	for (auto &child : children) {
		if (child.key_part.front() == key.front()) {
			return child.find(key);
		}
	}
	return {};
}